

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O1

uint64_t MercuryJson::extract_pseudo_structural_mask
                   (uint64_t structural_mask,uint64_t whitespace_mask,uint64_t quote_mask,
                   uint64_t literal_mask,uint64_t *prev_pseudo_structural_end_mask)

{
  ulong uVar1;
  
  uVar1 = *prev_pseudo_structural_end_mask;
  *prev_pseudo_structural_end_mask = (whitespace_mask | structural_mask) >> 0x3f;
  return (~(literal_mask | whitespace_mask) & ((whitespace_mask | structural_mask) * 2 | uVar1) |
         structural_mask | quote_mask) & (~quote_mask | literal_mask);
}

Assistant:

uint64_t extract_pseudo_structural_mask(
            uint64_t structural_mask, uint64_t whitespace_mask, uint64_t quote_mask, uint64_t literal_mask,
            uint64_t *prev_pseudo_structural_end_mask) {
        uint64_t st_ws = structural_mask | whitespace_mask;
        structural_mask |= quote_mask;
        uint64_t pseudo_structural_mask = (st_ws << 1U) | *prev_pseudo_structural_end_mask;
        *prev_pseudo_structural_end_mask = st_ws >> 63U;
        pseudo_structural_mask &= (~whitespace_mask) & (~literal_mask);
        structural_mask |= pseudo_structural_mask;
        structural_mask &= ~(quote_mask & ~literal_mask);
        return structural_mask;
    }